

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_has_filter(bcf_hdr_t *hdr,bcf1_t *line,char *filter)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((*filter == '.') && (filter[1] == '\0')) {
    filter = "PASS";
  }
  uVar2 = bcf_hdr_id2int(hdr,0,filter);
  iVar3 = -1;
  if ((-1 < (int)uVar2) && ((~(hdr->id[0][uVar2].val)->info[0] & 0xf) != 0)) {
    if ((line->unpacked & 2) == 0) {
      bcf_unpack(line,2);
    }
    uVar1 = (line->d).n_flt;
    iVar3 = 1;
    if (uVar2 != 0 || uVar1 != 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if ((line->d).flt[uVar4] == uVar2) {
            return 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int bcf_has_filter(const bcf_hdr_t *hdr, bcf1_t *line, char *filter)
{
    if ( filter[0]=='.' && !filter[1] ) filter = "PASS";
    int id = bcf_hdr_id2int(hdr, BCF_DT_ID, filter);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FLT,id) ) return -1;  // not defined in the header

    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    if ( id==0 && !line->d.n_flt) return 1; // PASS

    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( line->d.flt[i]==id ) return 1;
    return 0;
}